

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_http_server.c
# Opt level: O0

void test_url_callbacks(void)

{
  cio_error cVar1;
  cio_inet_address *arg1;
  int *expected;
  size_t sVar2;
  cio_http_client *client;
  char buffer [200];
  cio_http_location target;
  undefined1 local_288 [4];
  cio_error err;
  cio_http_server server;
  cio_http_server_configuration config;
  request_test request_test;
  uint i;
  
  for (request_test.expected_response = 0; (uint)request_test.expected_response < 0x10;
      request_test.expected_response = request_test.expected_response + 1) {
    memcpy(&config.free_client,
           test_url_callbacks::request_tests + (uint)request_test.expected_response,0x70);
    memcpy(server.keepalive_header + 0x20,&DAT_00124640,0xb8);
    arg1 = cio_get_inet_address_any4();
    cio_init_inet_socket_address((cio_socket_address *)(server.keepalive_header + 0x20),arg1,0x1f90)
    ;
    cVar1 = cio_http_server_init
                      ((cio_http_server *)local_288,&loop,
                       (cio_http_server_configuration *)(server.keepalive_header + 0x20));
    UnityAssertEqualNumber
              (0,(long)cVar1,"Server initialization failed!",0x5db,UNITY_DISPLAY_STYLE_INT);
    cVar1 = cio_http_location_init
                      ((cio_http_location *)(buffer + 0xc0),"/foo",&config.free_client,
                       (cio_http_alloc_handler_t)request_test.on_message_complete);
    UnityAssertEqualNumber
              (0,(long)cVar1,"Request target initialization failed!",0x5df,UNITY_DISPLAY_STYLE_INT);
    cVar1 = cio_http_server_register_location
                      ((cio_http_server *)local_288,(cio_http_location *)(buffer + 0xc0));
    UnityAssertEqualNumber
              (0,(long)cVar1,"Register request target failed!",0x5e1,UNITY_DISPLAY_STYLE_INT);
    snprintf((char *)&client,199,"GET %s://%s:%s%s?%s#%s HTTP/1.1\r\nContent-Length: 5\r\n\r\nHello"
             ,test_url_callbacks::scheme,test_url_callbacks::host,test_url_callbacks::port,
             test_url_callbacks::path,test_url_callbacks::query,test_url_callbacks::fragment);
    split_request((char *)&client);
    cVar1 = cio_http_server_serve((cio_http_server *)local_288);
    UnityAssertEqualNumber(0,(long)cVar1,"Serving http failed!",0x5f0,UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              ((long)(int)(uint)(request_test.alloc_handler._4_4_ == 500),
               (ulong)serve_error_fake.call_count,"Serve error callback was called!",0x5f1,
               UNITY_DISPLAY_STYLE_INT);
    expected = &client_socket[-2].impl.close_timer.impl.ev.fd;
    if (config.free_client != (cio_free_client_t)0x0) {
      UnityAssertEqualNumber
                (1,(ulong)on_schema_fake.call_count,"on_scheme callback was not called correctly!",
                 0x5f6,UNITY_DISPLAY_STYLE_INT);
      UnityAssertEqualNumber
                ((UNITY_INT)expected,(UNITY_INT)on_schema_fake.arg0_val,
                 "\'client\' parameter in on_scheme not correct",0x5f7,UNITY_DISPLAY_STYLE_INT);
      sVar2 = strlen(test_url_callbacks::scheme);
      UnityAssertEqualNumber
                (sVar2,on_schema_fake.arg2_val,"\'size\' parameter in on_scheme not correct",0x5f8,
                 UNITY_DISPLAY_STYLE_INT);
    }
    if (request_test.on_scheme != (cio_http_data_cb_t)0x0) {
      UnityAssertEqualNumber
                (1,(ulong)on_host_fake.call_count,"on_host callback was not called correctly!",0x5fc
                 ,UNITY_DISPLAY_STYLE_INT);
      UnityAssertEqualNumber
                ((UNITY_INT)expected,(UNITY_INT)on_host_fake.arg0_val,
                 "\'client\' parameter in on_host not correct",0x5fd,UNITY_DISPLAY_STYLE_INT);
      sVar2 = strlen(test_url_callbacks::host);
      UnityAssertEqualNumber
                (sVar2,on_host_fake.arg2_val,"\'size\' parameter in on_host not correct",0x5fe,
                 UNITY_DISPLAY_STYLE_INT);
    }
    if (request_test.on_host != (cio_http_data_cb_t)0x0) {
      UnityAssertEqualNumber
                (1,(ulong)on_port_fake.call_count,"on_port callback was not called correctly!",0x602
                 ,UNITY_DISPLAY_STYLE_INT);
      UnityAssertEqualNumber
                ((UNITY_INT)expected,(UNITY_INT)on_port_fake.arg0_val,
                 "\'client\' parameter in on_port not correct",0x603,UNITY_DISPLAY_STYLE_INT);
      sVar2 = strlen(test_url_callbacks::port);
      UnityAssertEqualNumber
                (sVar2,on_port_fake.arg2_val,"\'size\' parameter in on_port not correct",0x604,
                 UNITY_DISPLAY_STYLE_INT);
    }
    if (request_test.on_port != (cio_http_data_cb_t)0x0) {
      UnityAssertEqualNumber
                (1,(ulong)on_path_fake.call_count,"on_path callback was not called correctly!",0x608
                 ,UNITY_DISPLAY_STYLE_INT);
      UnityAssertEqualNumber
                ((UNITY_INT)expected,(UNITY_INT)on_path_fake.arg0_val,
                 "\'client\' parameter in on_path not correct",0x609,UNITY_DISPLAY_STYLE_INT);
      sVar2 = strlen(test_url_callbacks::path);
      UnityAssertEqualNumber
                (sVar2,on_path_fake.arg2_val,"\'size\' parameter in on_path not correct",0x60a,
                 UNITY_DISPLAY_STYLE_INT);
    }
    if (request_test.on_path != (cio_http_data_cb_t)0x0) {
      UnityAssertEqualNumber
                (1,(ulong)on_query_fake.call_count,"on_query callback was not called correctly!",
                 0x60e,UNITY_DISPLAY_STYLE_INT);
      UnityAssertEqualNumber
                ((UNITY_INT)expected,(UNITY_INT)on_query_fake.arg0_val,
                 "\'client\' parameter in on_query not correct",0x60f,UNITY_DISPLAY_STYLE_INT);
      sVar2 = strlen(test_url_callbacks::query);
      UnityAssertEqualNumber
                (sVar2,on_query_fake.arg2_val,"\'size\' parameter in on_query not correct",0x610,
                 UNITY_DISPLAY_STYLE_INT);
    }
    if (request_test.on_query != (cio_http_data_cb_t)0x0) {
      UnityAssertEqualNumber
                (1,(ulong)on_fragment_fake.call_count,
                 "on_fragment callback was not called correctly!",0x614,UNITY_DISPLAY_STYLE_INT);
      UnityAssertEqualNumber
                ((UNITY_INT)expected,(UNITY_INT)on_fragment_fake.arg0_val,
                 "\'client\' parameter in on_fragment not correct",0x615,UNITY_DISPLAY_STYLE_INT);
      sVar2 = strlen(test_url_callbacks::fragment);
      UnityAssertEqualNumber
                (sVar2,on_fragment_fake.arg2_val,"\'size\' parameter in on_fragment not correct",
                 0x616,UNITY_DISPLAY_STYLE_INT);
    }
    check_http_response(request_test.alloc_handler._4_4_);
    setUp();
  }
  free_dummy_client(client_socket);
  return;
}

Assistant:

static void test_url_callbacks(void)
{
	static const struct request_test request_tests[] = {
	    {.on_scheme = on_schema, .on_message_complete = message_complete_write_response, .alloc_handler = alloc_handler_for_callback_test, .callback_return = CIO_HTTP_CB_SUCCESS, .expected_response = 200},
	    {.on_host = on_host, .on_message_complete = message_complete_write_response, .alloc_handler = alloc_handler_for_callback_test, .callback_return = CIO_HTTP_CB_SUCCESS, .expected_response = 200},
	    {.on_port = on_port, .on_message_complete = message_complete_write_response, .alloc_handler = alloc_handler_for_callback_test, .callback_return = CIO_HTTP_CB_SUCCESS, .expected_response = 200},
	    {.on_path = on_path, .on_message_complete = message_complete_write_response, .alloc_handler = alloc_handler_for_callback_test, .callback_return = CIO_HTTP_CB_SUCCESS, .expected_response = 200},
	    {.on_query = on_query, .on_message_complete = message_complete_write_response, .alloc_handler = alloc_handler_for_callback_test, .callback_return = CIO_HTTP_CB_SUCCESS, .expected_response = 200},
	    {.on_fragment = on_fragment, .on_message_complete = message_complete_write_response, .alloc_handler = alloc_handler_for_callback_test, .callback_return = CIO_HTTP_CB_SUCCESS, .expected_response = 200},
	    {.on_scheme = on_schema, .on_message_complete = message_complete_write_response, .alloc_handler = alloc_handler_for_callback_test, .callback_return = CIO_HTTP_CB_ERROR, .expected_response = 400},
	    {.on_host = on_host, .on_message_complete = message_complete_write_response, .alloc_handler = alloc_handler_for_callback_test, .callback_return = CIO_HTTP_CB_ERROR, .expected_response = 400},
	    {.on_port = on_port, .on_message_complete = message_complete_write_response, .alloc_handler = alloc_handler_for_callback_test, .callback_return = CIO_HTTP_CB_ERROR, .expected_response = 400},
	    {.on_path = on_path, .on_message_complete = message_complete_write_response, .alloc_handler = alloc_handler_for_callback_test, .callback_return = CIO_HTTP_CB_ERROR, .expected_response = 400},
	    {.on_query = on_query, .on_message_complete = message_complete_write_response, .alloc_handler = alloc_handler_for_callback_test, .callback_return = CIO_HTTP_CB_ERROR, .expected_response = 400},
	    {.on_fragment = on_fragment, .on_message_complete = message_complete_write_response, .alloc_handler = alloc_handler_for_callback_test, .callback_return = CIO_HTTP_CB_ERROR, .expected_response = 400},
	    {.alloc_handler = alloc_handler_for_callback_test, .expected_response = 500},
	    {.on_scheme = on_schema, .alloc_handler = alloc_handler_for_callback_test, .expected_response = 500},
	    {.alloc_handler = alloc_failing_handler, .expected_response = 500},
	    {.alloc_handler = alloc_handler_with_no_free, .expected_response = 500},
	};

	for (unsigned int i = 0; i < ARRAY_SIZE(request_tests); i++) {
		struct request_test request_test = request_tests[i];

		struct cio_http_server_configuration config = {
		    .on_error = serve_error,
		    .read_header_timeout_ns = header_read_timeout,
		    .read_body_timeout_ns = body_read_timeout,
		    .response_timeout_ns = response_timeout,
		    .close_timeout_ns = 10,
		    .alloc_client = alloc_dummy_client,
		    .free_client = free_dummy_client};

		cio_init_inet_socket_address(&config.endpoint, cio_get_inet_address_any4(), 8080);

		struct cio_http_server server;
		enum cio_error err = cio_http_server_init(&server, &loop, &config);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Server initialization failed!");

		struct cio_http_location target;
		err = cio_http_location_init(&target, "/foo", &request_test, request_test.alloc_handler);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Request target initialization failed!");
		err = cio_http_server_register_location(&server, &target);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Register request target failed!");

		static const char *scheme = "http";
		static const char *host = "172.19.1.1";
		static const char *port = "8080";
		static const char *path = "/foo";
		static const char *query = "search=qry";
		static const char *fragment = "fraggy";

		char buffer[200];
		snprintf(buffer, sizeof(buffer) - 1, "GET %s://%s:%s%s?%s#%s HTTP/1.1" CRLF "Content-Length: 5" CRLF CRLF "Hello", scheme, host, port, path, query, fragment);

		split_request(buffer);

		err = cio_http_server_serve(&server);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Serving http failed!");
		TEST_ASSERT_EQUAL_MESSAGE(request_test.expected_response == 500 ? 1 : 0, serve_error_fake.call_count, "Serve error callback was called!");

		struct cio_http_client *client = cio_container_of(client_socket, struct cio_http_client, socket);

		if (request_test.on_scheme) {
			TEST_ASSERT_EQUAL_MESSAGE(1, on_schema_fake.call_count, "on_scheme callback was not called correctly!");
			TEST_ASSERT_EQUAL_MESSAGE(client, on_schema_fake.arg0_val, "'client' parameter in on_scheme not correct");
			TEST_ASSERT_EQUAL_MESSAGE(strlen(scheme), on_schema_fake.arg2_val, "'size' parameter in on_scheme not correct");
		}

		if (request_test.on_host) {
			TEST_ASSERT_EQUAL_MESSAGE(1, on_host_fake.call_count, "on_host callback was not called correctly!");
			TEST_ASSERT_EQUAL_MESSAGE(client, on_host_fake.arg0_val, "'client' parameter in on_host not correct");
			TEST_ASSERT_EQUAL_MESSAGE(strlen(host), on_host_fake.arg2_val, "'size' parameter in on_host not correct");
		}

		if (request_test.on_port) {
			TEST_ASSERT_EQUAL_MESSAGE(1, on_port_fake.call_count, "on_port callback was not called correctly!");
			TEST_ASSERT_EQUAL_MESSAGE(client, on_port_fake.arg0_val, "'client' parameter in on_port not correct");
			TEST_ASSERT_EQUAL_MESSAGE(strlen(port), on_port_fake.arg2_val, "'size' parameter in on_port not correct");
		}

		if (request_test.on_path) {
			TEST_ASSERT_EQUAL_MESSAGE(1, on_path_fake.call_count, "on_path callback was not called correctly!");
			TEST_ASSERT_EQUAL_MESSAGE(client, on_path_fake.arg0_val, "'client' parameter in on_path not correct");
			TEST_ASSERT_EQUAL_MESSAGE(strlen(path), on_path_fake.arg2_val, "'size' parameter in on_path not correct");
		}

		if (request_test.on_query) {
			TEST_ASSERT_EQUAL_MESSAGE(1, on_query_fake.call_count, "on_query callback was not called correctly!");
			TEST_ASSERT_EQUAL_MESSAGE(client, on_query_fake.arg0_val, "'client' parameter in on_query not correct");
			TEST_ASSERT_EQUAL_MESSAGE(strlen(query), on_query_fake.arg2_val, "'size' parameter in on_query not correct");
		}

		if (request_test.on_fragment) {
			TEST_ASSERT_EQUAL_MESSAGE(1, on_fragment_fake.call_count, "on_fragment callback was not called correctly!");
			TEST_ASSERT_EQUAL_MESSAGE(client, on_fragment_fake.arg0_val, "'client' parameter in on_fragment not correct");
			TEST_ASSERT_EQUAL_MESSAGE(strlen(fragment), on_fragment_fake.arg2_val, "'size' parameter in on_fragment not correct");
		}

		check_http_response(request_test.expected_response);

		setUp();
	}

	free_dummy_client(client_socket);
}